

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAttributeImpl.h
# Opt level: O0

void __thiscall irr::io::CIntAttribute::CIntAttribute(CIntAttribute *this,char *name,s32 value)

{
  uint in_EDX;
  char *in_RSI;
  IAttribute *in_RDI;
  void **in_stack_ffffffffffffffd8;
  IAttribute *this_00;
  
  this_00 = in_RDI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI->field_0x30);
  IAttribute::IAttribute(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI->_vptr_IAttribute = (_func_int **)0x442cd8;
  *(undefined8 *)&in_RDI->field_0x30 = 0x442d38;
  core::string<char>::operator=((string<char> *)this_00,in_RSI);
  (*in_RDI->_vptr_IAttribute[5])(in_RDI,(ulong)in_EDX);
  return;
}

Assistant:

CIntAttribute(const char *name, s32 value)
	{
		Name = name;
		setInt(value);
	}